

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock::GpuCounterDescriptor_GpuCounterBlock
          (GpuCounterDescriptor_GpuCounterBlock *this)

{
  GpuCounterDescriptor_GpuCounterBlock *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_GpuCounterBlock_009c0d20;
  this->block_id_ = 0;
  this->block_capacity_ = 0;
  ::std::__cxx11::string::string((string *)&this->name_);
  ::std::__cxx11::string::string((string *)&this->description_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->counter_ids_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<6UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

GpuCounterDescriptor_GpuCounterBlock::GpuCounterDescriptor_GpuCounterBlock() = default;